

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

Bigint * diff(Bigint *a,Bigint *b)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Bigint *pBVar5;
  int iVar6;
  ULong *pUVar7;
  Bigint *pBVar8;
  ULong *pUVar9;
  ulong uVar10;
  ULong *pUVar11;
  
  uVar3 = a->wds - b->wds;
  if (uVar3 == 0) {
    lVar4 = (long)b->wds * 4 + 0x1c;
    do {
      uVar3 = *(uint *)((long)a->x + lVar4 + -0x20);
      uVar1 = *(uint *)((long)b->x + lVar4 + -0x20);
      if (uVar3 != uVar1) {
        uVar3 = -(uint)(uVar3 < uVar1) | 1;
        goto LAB_00105c75;
      }
      lVar4 = lVar4 + -4;
    } while (0x1c < lVar4);
    uVar3 = 0;
  }
LAB_00105c75:
  if (uVar3 == 0) {
    pBVar5 = Balloc(0);
    pBVar5->wds = 1;
    pBVar5->x[0] = 0;
  }
  else {
    pBVar8 = a;
    if ((int)uVar3 < 0) {
      pBVar8 = b;
      b = a;
    }
    pBVar5 = Balloc(pBVar8->k);
    pBVar5->sign = uVar3 >> 0x1f;
    iVar6 = pBVar8->wds;
    iVar2 = b->wds;
    pUVar11 = b->x;
    pUVar7 = pBVar5->x;
    uVar10 = 0;
    pUVar9 = pBVar8->x;
    do {
      uVar3 = *pUVar11;
      uVar1 = *pUVar9;
      pUVar9 = pUVar9 + 1;
      pUVar11 = pUVar11 + 1;
      lVar4 = (ulong)uVar1 - (uVar3 + uVar10);
      *pUVar7 = (ULong)lVar4;
      uVar10 = (ulong)((uint)((ulong)lVar4 >> 0x20) & 1);
      pUVar7 = pUVar7 + 1;
    } while (pUVar11 < b->x + iVar2);
    for (; pUVar9 < pBVar8->x + iVar6; pUVar9 = pUVar9 + 1) {
      lVar4 = *pUVar9 - uVar10;
      uVar10 = (ulong)((uint)((ulong)lVar4 >> 0x20) & 1);
      *pUVar7 = (ULong)lVar4;
      pUVar7 = pUVar7 + 1;
    }
    iVar6 = iVar6 + 1;
    do {
      pUVar7 = pUVar7 + -1;
      iVar6 = iVar6 + -1;
    } while (*pUVar7 == 0);
    pBVar5->wds = iVar6;
  }
  return pBVar5;
}

Assistant:

static Bigint *
diff(Bigint *a, Bigint *b MTd)
{
	Bigint *c;
	int i, wa, wb;
	ULong *xa, *xae, *xb, *xbe, *xc;
#ifdef ULLong
	ULLong borrow, y;
#else
	ULong borrow, y;
#ifdef Pack_32
	ULong z;
#endif
#endif

	i = cmp(a,b);
	if (!i) {
		c = Balloc(0 MTa);
		c->wds = 1;
		c->x[0] = 0;
		return c;
		}
	if (i < 0) {
		c = a;
		a = b;
		b = c;
		i = 1;
		}
	else
		i = 0;
	c = Balloc(a->k MTa);
	c->sign = i;
	wa = a->wds;
	xa = a->x;
	xae = xa + wa;
	wb = b->wds;
	xb = b->x;
	xbe = xb + wb;
	xc = c->x;
	borrow = 0;
#ifdef ULLong
	do {
		y = (ULLong)*xa++ - *xb++ - borrow;
		borrow = y >> 32 & (ULong)1;
		*xc++ = y & FFFFFFFF;
		}
		while(xb < xbe);
	while(xa < xae) {
		y = *xa++ - borrow;
		borrow = y >> 32 & (ULong)1;
		*xc++ = y & FFFFFFFF;
		}
#else
#ifdef Pack_32
	do {
		y = (*xa & 0xffff) - (*xb & 0xffff) - borrow;
		borrow = (y & 0x10000) >> 16;
		z = (*xa++ >> 16) - (*xb++ >> 16) - borrow;
		borrow = (z & 0x10000) >> 16;
		Storeinc(xc, z, y);
		}
		while(xb < xbe);
	while(xa < xae) {
		y = (*xa & 0xffff) - borrow;
		borrow = (y & 0x10000) >> 16;
		z = (*xa++ >> 16) - borrow;
		borrow = (z & 0x10000) >> 16;
		Storeinc(xc, z, y);
		}
#else
	do {
		y = *xa++ - *xb++ - borrow;
		borrow = (y & 0x10000) >> 16;
		*xc++ = y & 0xffff;
		}
		while(xb < xbe);
	while(xa < xae) {
		y = *xa++ - borrow;
		borrow = (y & 0x10000) >> 16;
		*xc++ = y & 0xffff;
		}
#endif
#endif
	while(!*--xc)
		wa--;
	c->wds = wa;
	return c;
	}